

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpanContext.h
# Opt level: O1

bool jaegertracing::operator==(SpanContext *lhs,SpanContext *rhs)

{
  size_t __n;
  bool bVar1;
  __type _Var2;
  int iVar3;
  
  std::lock<std::mutex,std::mutex>(&lhs->_mutex,&rhs->_mutex);
  bVar1 = std::__detail::
          _Equality<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
          ::_M_equal((_Equality<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      *)&lhs->_baggage,&(rhs->_baggage)._M_h);
  pthread_mutex_unlock((pthread_mutex_t *)&rhs->_mutex);
  pthread_mutex_unlock((pthread_mutex_t *)&lhs->_mutex);
  if (((((bVar1) && ((lhs->_traceID)._high == (rhs->_traceID)._high)) &&
       ((lhs->_traceID)._low == (rhs->_traceID)._low)) &&
      ((lhs->_spanID == rhs->_spanID && (lhs->_parentID == rhs->_parentID)))) &&
     ((lhs->_flags == rhs->_flags &&
      (__n = (lhs->_debugID)._M_string_length, __n == (rhs->_debugID)._M_string_length)))) {
    if ((__n != 0) &&
       (iVar3 = bcmp((lhs->_debugID)._M_dataplus._M_p,(rhs->_debugID)._M_dataplus._M_p,__n),
       iVar3 != 0)) {
      return false;
    }
    _Var2 = std::operator==(&lhs->_traceState,&rhs->_traceState);
    return _Var2;
  }
  return false;
}

Assistant:

bool operator==(const SpanContext& lhs, const SpanContext& rhs)
    {
        {
            std::lock(lhs._mutex, rhs._mutex);
            std::lock_guard<std::mutex> lhsLock(lhs._mutex, std::adopt_lock);
            std::lock_guard<std::mutex> rhsLock(rhs._mutex, std::adopt_lock);
            if (lhs._baggage != rhs._baggage) {
                return false;
            }
        }
        return lhs._traceID == rhs._traceID && lhs._spanID == rhs._spanID &&
               lhs._parentID == rhs._parentID && lhs._flags == rhs._flags &&
               lhs._debugID == rhs._debugID &&
               lhs._traceState == rhs._traceState;
    }